

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int xmlXPathNodeSetAddUnique(xmlNodeSetPtr cur,xmlNodePtr val)

{
  int iVar1;
  xmlNodePtr *ppxVar2;
  xmlNodePtr pxVar3;
  xmlNsPtr ns;
  xmlNodePtr *temp;
  xmlNodePtr val_local;
  xmlNodeSetPtr cur_local;
  
  if ((cur == (xmlNodeSetPtr)0x0) || (val == (xmlNodePtr)0x0)) {
    return -1;
  }
  if (cur->nodeMax == 0) {
    ppxVar2 = (xmlNodePtr *)(*xmlMalloc)(0x50);
    cur->nodeTab = ppxVar2;
    if (cur->nodeTab == (xmlNodePtr *)0x0) {
      xmlXPathErrMemory((xmlXPathContextPtr)0x0,"growing nodeset\n");
      return -1;
    }
    memset(cur->nodeTab,0,0x50);
    cur->nodeMax = 10;
  }
  else if (cur->nodeNr == cur->nodeMax) {
    if (9999999 < cur->nodeMax) {
      xmlXPathErrMemory((xmlXPathContextPtr)0x0,"growing nodeset hit limit\n");
      return -1;
    }
    ppxVar2 = (xmlNodePtr *)(*xmlRealloc)(cur->nodeTab,(long)(cur->nodeMax << 1) << 3);
    if (ppxVar2 == (xmlNodePtr *)0x0) {
      xmlXPathErrMemory((xmlXPathContextPtr)0x0,"growing nodeset\n");
      return -1;
    }
    cur->nodeTab = ppxVar2;
    cur->nodeMax = cur->nodeMax << 1;
  }
  if (val->type == XML_NAMESPACE_DECL) {
    pxVar3 = xmlXPathNodeSetDupNs((xmlNodePtr)val->_private,(xmlNsPtr)val);
    iVar1 = cur->nodeNr;
    cur->nodeNr = iVar1 + 1;
    cur->nodeTab[iVar1] = pxVar3;
  }
  else {
    iVar1 = cur->nodeNr;
    cur->nodeNr = iVar1 + 1;
    cur->nodeTab[iVar1] = val;
  }
  return 0;
}

Assistant:

int
xmlXPathNodeSetAddUnique(xmlNodeSetPtr cur, xmlNodePtr val) {
    if ((cur == NULL) || (val == NULL)) return(-1);

    /* @@ with_ns to check whether namespace nodes should be looked at @@ */
    /*
     * grow the nodeTab if needed
     */
    if (cur->nodeMax == 0) {
        cur->nodeTab = (xmlNodePtr *) xmlMalloc(XML_NODESET_DEFAULT *
					     sizeof(xmlNodePtr));
	if (cur->nodeTab == NULL) {
	    xmlXPathErrMemory(NULL, "growing nodeset\n");
	    return(-1);
	}
	memset(cur->nodeTab, 0 ,
	       XML_NODESET_DEFAULT * (size_t) sizeof(xmlNodePtr));
        cur->nodeMax = XML_NODESET_DEFAULT;
    } else if (cur->nodeNr == cur->nodeMax) {
        xmlNodePtr *temp;

        if (cur->nodeMax >= XPATH_MAX_NODESET_LENGTH) {
            xmlXPathErrMemory(NULL, "growing nodeset hit limit\n");
            return(-1);
        }
	temp = (xmlNodePtr *) xmlRealloc(cur->nodeTab, cur->nodeMax * 2 *
				      sizeof(xmlNodePtr));
	if (temp == NULL) {
	    xmlXPathErrMemory(NULL, "growing nodeset\n");
	    return(-1);
	}
	cur->nodeTab = temp;
        cur->nodeMax *= 2;
    }
    if (val->type == XML_NAMESPACE_DECL) {
	xmlNsPtr ns = (xmlNsPtr) val;

        /* TODO: Check memory error. */
	cur->nodeTab[cur->nodeNr++] =
	    xmlXPathNodeSetDupNs((xmlNodePtr) ns->next, ns);
    } else
	cur->nodeTab[cur->nodeNr++] = val;
    return(0);
}